

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_search.c
# Opt level: O0

void ares_dnsrec_convert_cb
               (void *arg,ares_status_t status,size_t timeouts,ares_dns_record_t *dnsrec)

{
  ares_status_t aVar1;
  size_t sStack_40;
  ares_status_t mystatus;
  size_t alen;
  uchar *abuf;
  dnsrec_convert_arg_t *carg;
  ares_dns_record_t *dnsrec_local;
  size_t timeouts_local;
  void *pvStack_10;
  ares_status_t status_local;
  void *arg_local;
  
  alen = 0;
  sStack_40 = 0;
  abuf = (uchar *)arg;
  carg = (dnsrec_convert_arg_t *)dnsrec;
  dnsrec_local = (ares_dns_record_t *)timeouts;
  timeouts_local._4_4_ = status;
  pvStack_10 = arg;
  if ((dnsrec != (ares_dns_record_t *)0x0) &&
     (timeouts_local._4_4_ = status,
     aVar1 = ares_dns_write(dnsrec,(uchar **)&alen,&stack0xffffffffffffffc0), aVar1 != ARES_SUCCESS)
     ) {
    timeouts_local._4_4_ = aVar1;
  }
  (**(code **)abuf)(*(undefined8 *)(abuf + 8),timeouts_local._4_4_,(ulong)dnsrec_local & 0xffffffff,
                    alen,sStack_40);
  ares_free((void *)alen);
  ares_free(abuf);
  return;
}

Assistant:

void ares_dnsrec_convert_cb(void *arg, ares_status_t status, size_t timeouts,
                            const ares_dns_record_t *dnsrec)
{
  dnsrec_convert_arg_t *carg = arg;
  unsigned char        *abuf = NULL;
  size_t                alen = 0;

  if (dnsrec != NULL) {
    ares_status_t mystatus = ares_dns_write(dnsrec, &abuf, &alen);
    if (mystatus != ARES_SUCCESS) {
      status = mystatus;
    }
  }

  carg->callback(carg->arg, (int)status, (int)timeouts, abuf, (int)alen);

  ares_free(abuf);
  ares_free(carg);
}